

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O0

void __thiscall fasttext::FastText::buildModel(FastText *this)

{
  element_type *peVar1;
  shared_ptr<fasttext::Model> *in_RDI;
  bool normalizeGradient;
  shared_ptr<fasttext::Loss> loss;
  shared_ptr<fasttext::Matrix> *in_stack_00000080;
  FastText *in_stack_00000088;
  shared_ptr<fasttext::Model> *this_00;
  bool *in_stack_ffffffffffffffd0;
  shared_ptr<fasttext::Loss> *in_stack_ffffffffffffffd8;
  undefined7 in_stack_ffffffffffffffe0;
  shared_ptr<fasttext::Matrix> *in_stack_ffffffffffffffe8;
  
  this_00 = in_RDI + 3;
  createLoss(in_stack_00000088,in_stack_00000080);
  peVar1 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x197f56);
  std::
  make_shared<fasttext::Model,std::shared_ptr<fasttext::Matrix>&,std::shared_ptr<fasttext::Matrix>&,std::shared_ptr<fasttext::Loss>&,bool&>
            (in_stack_ffffffffffffffe8,
             (shared_ptr<fasttext::Matrix> *)
             CONCAT17(peVar1->model == sup,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffd8,
             in_stack_ffffffffffffffd0);
  std::shared_ptr<fasttext::Model>::operator=(this_00,in_RDI);
  std::shared_ptr<fasttext::Model>::~shared_ptr((shared_ptr<fasttext::Model> *)0x197fa3);
  std::shared_ptr<fasttext::Loss>::~shared_ptr((shared_ptr<fasttext::Loss> *)0x197fad);
  return;
}

Assistant:

void FastText::buildModel() {
  auto loss = createLoss(output_);
  bool normalizeGradient = (args_->model == model_name::sup);
  model_ = std::make_shared<Model>(input_, output_, loss, normalizeGradient);
}